

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  string prefix;
  string suffix;
  string local_b8;
  string local_98;
  string local_78;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->Base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Base).field_2
  ;
  (__return_storage_ptr__->Base)._M_string_length = 0;
  (__return_storage_ptr__->Base).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Output).field_2;
  (__return_storage_ptr__->Output)._M_string_length = 0;
  (__return_storage_ptr__->Output).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Real)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Real).field_2
  ;
  (__return_storage_ptr__->Real)._M_string_length = 0;
  (__return_storage_ptr__->Real).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ImportLibrary)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ImportLibrary).field_2;
  (__return_storage_ptr__->ImportLibrary)._M_string_length = 0;
  (__return_storage_ptr__->ImportLibrary).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->PDB)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->PDB).field_2;
  (__return_storage_ptr__->PDB)._M_string_length = 0;
  (__return_storage_ptr__->PDB).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->SharedObject)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->SharedObject).field_2;
  (__return_storage_ptr__->SharedObject)._M_string_length = 0;
  (__return_storage_ptr__->SharedObject).field_2._M_local_buf[0] = '\0';
  paVar2 = &local_b8.field_2;
  if (this->Target->IsImportedTarget == true) {
    local_78._M_dataplus._M_p = (pointer)0x2e;
    local_b8._M_dataplus._M_p = (pointer)paVar2;
    local_b8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_78);
    local_b8.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
    builtin_strncpy(local_b8._M_dataplus._M_p,"GetExecutableNames called on imported target: ",0x2e)
    ;
    local_b8._M_string_length = (size_type)local_78._M_dataplus._M_p;
    local_b8._M_dataplus._M_p[(long)local_78._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)(this->Target->Name)._M_dataplus._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_b8._M_string_length = 7;
  local_b8.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  pcVar4 = GetProperty(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (this->Target->TargetTypeValue == EXECUTABLE) {
    local_b8.field_2._M_allocated_capacity._0_6_ = 0x45444f4358;
    local_b8._M_string_length = 5;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    bVar3 = cmMakefile::IsOn(this->Makefile,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) goto LAB_0016c610;
  }
  pcVar4 = (char *)0x0;
LAB_0016c610:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity =
       local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&local_b8,&__return_storage_ptr__->Base,
                      &local_78);
  local_58 = pcVar4;
  std::operator+(&local_50,&local_b8,&__return_storage_ptr__->Base);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_98.field_2._M_allocated_capacity = *psVar6;
    local_98.field_2._8_8_ = plVar5[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar6;
    local_98._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_98._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &__return_storage_ptr__->Real;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)psVar1);
  if (local_58 != (char *)0x0) {
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
  }
  GetFullNameInternal(&local_98,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  GetPDBName(&local_98,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The executable name.
  targetNames.Output = prefix + targetNames.Base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}